

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O0

PVG_FT_Error
PVG_FT_Stroker_GetBorderCounts
          (PVG_FT_Stroker stroker,PVG_FT_StrokerBorder border,PVG_FT_UInt *anum_points,
          PVG_FT_UInt *anum_contours)

{
  PVG_FT_Error local_34;
  PVG_FT_UInt local_30;
  PVG_FT_Error error;
  PVG_FT_UInt num_contours;
  PVG_FT_UInt num_points;
  PVG_FT_UInt *anum_contours_local;
  PVG_FT_UInt *anum_points_local;
  PVG_FT_Stroker pPStack_10;
  PVG_FT_StrokerBorder border_local;
  PVG_FT_Stroker stroker_local;
  
  error = 0;
  local_30 = 0;
  _num_contours = anum_contours;
  anum_contours_local = anum_points;
  if ((stroker == (PVG_FT_Stroker)0x0) || (PVG_FT_STROKER_BORDER_RIGHT < border)) {
    local_34 = -1;
  }
  else {
    anum_points_local._4_4_ = border;
    pPStack_10 = stroker;
    local_34 = ft_stroke_border_get_counts
                         (stroker->borders + border,(PVG_FT_UInt *)&error,&local_30);
  }
  if (anum_contours_local != (PVG_FT_UInt *)0x0) {
    *anum_contours_local = error;
  }
  if (_num_contours != (PVG_FT_UInt *)0x0) {
    *_num_contours = local_30;
  }
  return local_34;
}

Assistant:

PVG_FT_Error PVG_FT_Stroker_GetBorderCounts(PVG_FT_Stroker       stroker,
                                          PVG_FT_StrokerBorder border,
                                          PVG_FT_UInt*         anum_points,
                                          PVG_FT_UInt*         anum_contours)
{
    PVG_FT_UInt  num_points = 0, num_contours = 0;
    PVG_FT_Error error;

    if (!stroker || border > 1) {
        error = -1;  // PVG_FT_THROW( Invalid_Argument );
        goto Exit;
    }

    error = ft_stroke_border_get_counts(stroker->borders + border, &num_points,
                                        &num_contours);
Exit:
    if (anum_points) *anum_points = num_points;

    if (anum_contours) *anum_contours = num_contours;

    return error;
}